

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CupdlpWrapper.cpp
# Opt level: O2

int formulateLP_highs(HighsLp *lp,double **cost,int *nCols,int *nRows,int *nnz,int *nEqs,
                     int **csc_beg,int **csc_idx,double **csc_val,double **rhs,double **lower,
                     double **upper,double *offset,double *sense_origin,int *nCols_origin,
                     int **constraint_new_idx,int **constraint_type)

{
  double *pdVar1;
  size_t __size;
  double dVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer piVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  pointer pdVar14;
  int i_2;
  int *piVar15;
  long lVar16;
  double *pdVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  double dVar27;
  
  uVar3 = lp->num_col_;
  uVar23 = (ulong)uVar3;
  uVar4 = lp->num_row_;
  uVar20 = (ulong)uVar4;
  lVar26 = (long)(int)uVar3;
  piVar7 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar22 = piVar7[lVar26];
  *nCols_origin = uVar3;
  *nRows = uVar4;
  *nCols = uVar3;
  *nEqs = 0;
  *nnz = iVar22;
  *offset = lp->offset_;
  if (lp->sense_ == kMinimize) {
    dVar27 = 1.0;
  }
  else {
    if (lp->sense_ != kMaximize) goto LAB_002f0ffb;
    dVar27 = -1.0;
  }
  *sense_origin = dVar27;
LAB_002f0ffb:
  pdVar8 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar10 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar11 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar22 = *nRows;
  piVar15 = (int *)malloc((long)iVar22 << 2);
  *constraint_type = piVar15;
  piVar15 = (int *)malloc((long)iVar22 << 2);
  *constraint_new_idx = piVar15;
  if ((int)uVar4 < 1) {
    uVar20 = 0;
  }
  for (uVar21 = 0; uVar20 != uVar21; uVar21 = uVar21 + 1) {
    dVar27 = pdVar8[uVar21];
    dVar2 = pdVar9[uVar21];
    if (((1e+20 <= dVar2 || dVar27 <= -1e+20) || (dVar27 != dVar2)) || (NAN(dVar27) || NAN(dVar2)))
    {
      if ((dVar27 <= -1e+20) || (dVar2 < 1e+20)) {
        if (-1e+20 < dVar27 || 1e+20 <= dVar2) {
          if (1e+20 <= dVar2 || dVar27 <= -1e+20) {
            printf("Warning: constraint %d has no lower and upper bound\n",uVar21 & 0xffffffff);
          }
          (*constraint_type)[uVar21] = 3;
          *nCols = *nCols + 1;
          *nnz = *nnz + 1;
          goto LAB_002f10f2;
        }
        (*constraint_type)[uVar21] = 1;
      }
      else {
        (*constraint_type)[uVar21] = 2;
      }
    }
    else {
      (*constraint_type)[uVar21] = 0;
LAB_002f10f2:
      *nEqs = *nEqs + 1;
    }
  }
  uVar4 = *nCols;
  lVar16 = (long)(int)uVar4;
  __size = lVar16 * 8;
  pdVar17 = (double *)malloc(__size);
  *cost = pdVar17;
  pdVar17 = (double *)malloc(__size);
  *lower = pdVar17;
  pdVar17 = (double *)malloc(__size);
  *upper = pdVar17;
  piVar15 = (int *)malloc(lVar16 * 4 + 4);
  *csc_beg = piVar15;
  iVar22 = *nnz;
  piVar15 = (int *)malloc((long)iVar22 * 4);
  *csc_idx = piVar15;
  pdVar17 = (double *)malloc((long)iVar22 << 3);
  *csc_val = pdVar17;
  uVar5 = *nRows;
  uVar21 = (ulong)(int)uVar5;
  pdVar17 = (double *)malloc(uVar21 << 3);
  *rhs = pdVar17;
  pdVar12 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar13 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar14 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar25 = 0;
  uVar20 = 0;
  if (0 < (int)uVar3) {
    uVar20 = uVar23;
  }
  for (; lVar18 = lVar26, uVar20 != uVar25; uVar25 = uVar25 + 1) {
    (*cost)[uVar25] = pdVar12[uVar25] * *sense_origin;
    (*lower)[uVar25] = pdVar13[uVar25];
    (*upper)[uVar25] = pdVar14[uVar25];
  }
  for (; lVar18 < lVar16; lVar18 = lVar18 + 1) {
    (*cost)[lVar18] = 0.0;
  }
  uVar19 = 0;
  uVar24 = 0;
  uVar25 = uVar23;
  if (0 < (int)uVar5) {
    uVar24 = (ulong)uVar5;
  }
  for (; uVar24 != uVar19; uVar19 = uVar19 + 1) {
    if ((*constraint_type)[uVar19] == 3) {
      iVar22 = (int)uVar25;
      (*lower)[iVar22] = pdVar8[uVar19];
      (*upper)[iVar22] = pdVar9[uVar19];
      uVar25 = (ulong)(iVar22 + 1);
    }
  }
  uVar19 = 0;
  uVar25 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar25 = uVar19;
  }
  for (; uVar25 != uVar19; uVar19 = uVar19 + 1) {
    pdVar1 = *lower + uVar19;
    if (*pdVar1 <= -1e+20 && *pdVar1 != -1e+20) {
      (*lower)[uVar19] = -INFINITY;
    }
    if (1e+20 < (*upper)[uVar19]) {
      (*upper)[uVar19] = INFINITY;
    }
  }
  iVar22 = 0;
  for (lVar16 = 0; lVar16 < (int)uVar21; lVar16 = lVar16 + 1) {
    if ((*constraint_type)[lVar16] == 3) {
      dVar27 = 0.0;
LAB_002f13ec:
      pdVar17[iVar22] = dVar27;
      (*constraint_new_idx)[lVar16] = iVar22;
      iVar22 = iVar22 + 1;
    }
    else if ((*constraint_type)[lVar16] == 0) {
      dVar27 = pdVar8[lVar16];
      goto LAB_002f13ec;
    }
    uVar21 = (ulong)(uint)*nRows;
  }
  iVar22 = *nEqs;
  lVar16 = 0;
  do {
    if ((int)uVar21 <= lVar16) {
      for (lVar16 = 0; lVar16 <= lVar26; lVar16 = lVar16 + 1) {
        (*csc_beg)[lVar16] = piVar7[lVar16];
      }
      for (; lVar26 < *nCols; lVar26 = lVar26 + 1) {
        (*csc_beg)[lVar26 + 1] = (*csc_beg)[lVar26] + 1;
      }
      iVar22 = 0;
      uVar21 = 0;
      do {
        if (uVar21 == uVar20) {
          for (lVar26 = 0; lVar26 < *nRows; lVar26 = lVar26 + 1) {
            if ((*constraint_type)[lVar26] == 3) {
              piVar15 = *csc_beg;
              iVar22 = (int)uVar23;
              (*csc_idx)[piVar15[iVar22]] = (*constraint_new_idx)[lVar26];
              (*csc_val)[piVar15[iVar22]] = -1.0;
              uVar23 = (ulong)(iVar22 + 1);
            }
          }
          return 0;
        }
        piVar15 = *csc_beg;
        uVar25 = uVar21 + 1;
        for (lVar26 = (long)piVar15[uVar21]; uVar19 = (ulong)piVar15[uVar25], lVar26 < (long)uVar19;
            lVar26 = lVar26 + 1) {
          iVar6 = piVar10[lVar26];
          if (((*constraint_type)[iVar6] == 3) || ((*constraint_type)[iVar6] == 0)) {
            (*csc_idx)[iVar22] = (*constraint_new_idx)[iVar6];
            (*csc_val)[iVar22] = pdVar11[lVar26];
            iVar22 = iVar22 + 1;
          }
        }
        for (lVar26 = (long)piVar15[uVar21]; uVar21 = uVar25, lVar26 < (int)uVar19;
            lVar26 = lVar26 + 1) {
          iVar6 = piVar10[lVar26];
          if ((*constraint_type)[iVar6] == 2) {
            (*csc_idx)[iVar22] = (*constraint_new_idx)[iVar6];
            dVar27 = pdVar11[lVar26];
LAB_002f1563:
            (*csc_val)[iVar22] = dVar27;
            iVar22 = iVar22 + 1;
          }
          else if ((*constraint_type)[iVar6] == 1) {
            (*csc_idx)[iVar22] = (*constraint_new_idx)[iVar6];
            dVar27 = -pdVar11[lVar26];
            goto LAB_002f1563;
          }
          uVar19 = (ulong)(uint)piVar15[uVar25];
        }
      } while( true );
    }
    if ((*constraint_type)[lVar16] == 2) {
      dVar27 = pdVar8[lVar16];
LAB_002f144f:
      pdVar17[iVar22] = dVar27;
      (*constraint_new_idx)[lVar16] = iVar22;
      iVar22 = iVar22 + 1;
    }
    else if ((*constraint_type)[lVar16] == 1) {
      dVar27 = -pdVar9[lVar16];
      goto LAB_002f144f;
    }
    lVar16 = lVar16 + 1;
    uVar21 = (ulong)(uint)*nRows;
  } while( true );
}

Assistant:

int formulateLP_highs(const HighsLp& lp, double** cost, int* nCols, int* nRows,
                      int* nnz, int* nEqs, int** csc_beg, int** csc_idx,
                      double** csc_val, double** rhs, double** lower,
                      double** upper, double* offset, double* sense_origin,
                      int* nCols_origin, int** constraint_new_idx,
                      int** constraint_type) {
  int retcode = 0;

  // problem size for malloc
  int nCols_clp = lp.num_col_;
  int nRows_clp = lp.num_row_;
  int nnz_clp = lp.a_matrix_.start_[lp.num_col_];
  *nCols_origin = nCols_clp;
  *nRows = nRows_clp;    // need not recalculate
  *nCols = nCols_clp;    // need recalculate
  *nEqs = 0;             // need recalculate
  *nnz = nnz_clp;        // need recalculate
  *offset = lp.offset_;  // need not recalculate
  if (lp.sense_ == ObjSense::kMinimize) {
    *sense_origin = 1.0;
  } else if (lp.sense_ == ObjSense::kMaximize) {
    *sense_origin = -1.0;
  }

  const double* lhs_clp = lp.row_lower_.data();
  const double* rhs_clp = lp.row_upper_.data();
  const HighsInt* A_csc_beg = lp.a_matrix_.start_.data();
  const HighsInt* A_csc_idx = lp.a_matrix_.index_.data();
  const double* A_csc_val = lp.a_matrix_.value_.data();
  int has_lower, has_upper;

  cupdlp_init_int(*constraint_type, *nRows);
  cupdlp_init_int(*constraint_new_idx, *nRows);

  // recalculate nRows and nnz for Ax - z = 0
  for (int i = 0; i < nRows_clp; i++) {
    has_lower = lhs_clp[i] > -1e20;
    has_upper = rhs_clp[i] < 1e20;

    // count number of equations and rows
    if (has_lower && has_upper && lhs_clp[i] == rhs_clp[i]) {
      (*constraint_type)[i] = EQ;
      (*nEqs)++;
    } else if (has_lower && !has_upper) {
      (*constraint_type)[i] = GEQ;
    } else if (!has_lower && has_upper) {
      (*constraint_type)[i] = LEQ;
    } else if (has_lower && has_upper) {
      (*constraint_type)[i] = BOUND;
      (*nCols)++;
      (*nnz)++;
      (*nEqs)++;
    } else {
      // printf("Error: constraint %d has no lower and upper bound\n", i);
      // retcode = 1;
      // goto exit_cleanup;

      // what if regard free as bounded
      printf("Warning: constraint %d has no lower and upper bound\n", i);
      (*constraint_type)[i] = BOUND;
      (*nCols)++;
      (*nnz)++;
      (*nEqs)++;
    }
  }

  // allocate memory
  cupdlp_init_double(*cost, *nCols);
  cupdlp_init_double(*lower, *nCols);
  cupdlp_init_double(*upper, *nCols);
  cupdlp_init_int(*csc_beg, *nCols + 1);
  cupdlp_init_int(*csc_idx, *nnz);
  cupdlp_init_double(*csc_val, *nnz);
  cupdlp_init_double(*rhs, *nRows);

  // cost, lower, upper
  for (int i = 0; i < nCols_clp; i++) {
    (*cost)[i] = lp.col_cost_[i] * (*sense_origin);
    (*lower)[i] = lp.col_lower_[i];

    (*upper)[i] = lp.col_upper_[i];
  }
  // slack costs
  for (int i = nCols_clp; i < *nCols; i++) {
    (*cost)[i] = 0.0;
  }
  // slack bounds
  for (int i = 0, j = nCols_clp; i < *nRows; i++) {
    if ((*constraint_type)[i] == BOUND) {
      (*lower)[j] = lhs_clp[i];
      (*upper)[j] = rhs_clp[i];
      j++;
    }
  }

  for (int i = 0; i < *nCols; i++) {
    if ((*lower)[i] < -1e20) (*lower)[i] = -INFINITY;
    if ((*upper)[i] > 1e20) (*upper)[i] = INFINITY;
  }

  // permute LP rhs
  // EQ or BOUND first
  for (int i = 0, j = 0; i < *nRows; i++) {
    if ((*constraint_type)[i] == EQ) {
      (*rhs)[j] = lhs_clp[i];
      (*constraint_new_idx)[i] = j;
      j++;
    } else if ((*constraint_type)[i] == BOUND) {
      (*rhs)[j] = 0.0;
      (*constraint_new_idx)[i] = j;
      j++;
    }
  }
  // then LEQ or GEQ
  for (int i = 0, j = *nEqs; i < *nRows; i++) {
    if ((*constraint_type)[i] == LEQ) {
      (*rhs)[j] = -rhs_clp[i];  // multiply -1
      (*constraint_new_idx)[i] = j;
      j++;
    } else if ((*constraint_type)[i] == GEQ) {
      (*rhs)[j] = lhs_clp[i];
      (*constraint_new_idx)[i] = j;
      j++;
    }
  }

  // formulate and permute LP matrix
  // beg remains the same
  for (int i = 0; i < nCols_clp + 1; i++) (*csc_beg)[i] = A_csc_beg[i];
  for (int i = nCols_clp + 1; i < *nCols + 1; i++)
    (*csc_beg)[i] = (*csc_beg)[i - 1] + 1;

  // row idx changes
  for (int i = 0, k = 0; i < nCols_clp; i++) {
    // same order as in rhs
    // EQ or BOUND first
    for (int j = (*csc_beg)[i]; j < (*csc_beg)[i + 1]; j++) {
      if ((*constraint_type)[A_csc_idx[j]] == EQ ||
          (*constraint_type)[A_csc_idx[j]] == BOUND) {
        (*csc_idx)[k] = (*constraint_new_idx)[A_csc_idx[j]];
        (*csc_val)[k] = A_csc_val[j];
        k++;
      }
    }
    // then LEQ or GEQ
    for (int j = (*csc_beg)[i]; j < (*csc_beg)[i + 1]; j++) {
      if ((*constraint_type)[A_csc_idx[j]] == LEQ) {
        (*csc_idx)[k] = (*constraint_new_idx)[A_csc_idx[j]];
        (*csc_val)[k] = -A_csc_val[j];  // multiply -1
        k++;
      } else if ((*constraint_type)[A_csc_idx[j]] == GEQ) {
        (*csc_idx)[k] = (*constraint_new_idx)[A_csc_idx[j]];
        (*csc_val)[k] = A_csc_val[j];
        k++;
      }
    }
  }

  // slacks for BOUND
  for (int i = 0, j = nCols_clp; i < *nRows; i++) {
    if ((*constraint_type)[i] == BOUND) {
      (*csc_idx)[(*csc_beg)[j]] = (*constraint_new_idx)[i];
      (*csc_val)[(*csc_beg)[j]] = -1.0;
      j++;
    }
  }

  return retcode;
}